

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port.cc
# Opt level: O1

Map * google::protobuf::internal::CounterMap(void)

{
  int iVar1;
  _Rb_tree_header *p_Var2;
  
  if (CounterMap()::counter_map == '\0') {
    iVar1 = __cxa_guard_acquire(&CounterMap()::counter_map);
    if (iVar1 != 0) {
      CounterMap::counter_map = (Map *)operator_new(0x30);
      p_Var2 = &(CounterMap::counter_map->_M_t)._M_impl.super__Rb_tree_header;
      (CounterMap::counter_map->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      (CounterMap::counter_map->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
           (_Base_ptr)0x0;
      (CounterMap::counter_map->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
           (_Base_ptr)0x0;
      (CounterMap::counter_map->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
      *(undefined8 *)&(CounterMap::counter_map->_M_t)._M_impl = 0;
      *(undefined8 *)&(CounterMap::counter_map->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
      (CounterMap::counter_map->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
           &p_Var2->_M_header;
      (CounterMap::counter_map->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
           &p_Var2->_M_header;
      (CounterMap::counter_map->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
      __cxa_guard_release(&CounterMap()::counter_map);
    }
  }
  if (CounterMap()::dummy == '\0') {
    CounterMap();
  }
  return CounterMap::counter_map;
}

Assistant:

static auto& CounterMap() {
  using Map = std::map<absl::string_view,
                       std::map<std::variant<int64_t, absl::string_view>,
                                std::vector<const RealDebugCounter*>>>;
  static auto* counter_map = new Map{};
  static bool dummy = std::atexit(PrintAllCounters);
  (void)dummy;
  return *counter_map;
}